

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenIndexBasedFieldGetter(CppGenerator *this,StructDef *struct_def)

{
  CodeWriter *this_00;
  bool bVar1;
  string *text;
  pointer ppFVar2;
  allocator<char> local_189;
  CppGenerator *local_188;
  long local_180;
  pointer local_178;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_188 = this;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"  template<size_t Index>",(allocator<char> *)&local_170);
    this_00 = &local_188->code_;
    CodeWriter::operator+=(this_00,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"  auto get_field() const {",(allocator<char> *)&local_170);
    CodeWriter::operator+=(this_00,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    ppFVar2 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_178 = (struct_def->fields).vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    local_180 = 0;
    bVar1 = false;
    for (; ppFVar2 != local_178; ppFVar2 = ppFVar2 + 1) {
      if ((*ppFVar2)->deprecated == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"FIELD_NAME",&local_189);
        Name_abi_cxx11_(&local_d0,local_188,*ppFVar2);
        CodeWriter::SetValue(this_00,&local_170,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"FIELD_INDEX",&local_189);
        std::__cxx11::to_string(&local_d0,local_180);
        CodeWriter::SetValue(this_00,&local_170,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_170);
        if (bVar1) {
          text = &local_50;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)text,"    else \\",(allocator<char> *)&local_170);
          CodeWriter::operator+=(this_00,text);
        }
        else {
          text = &local_70;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)text,"         \\",(allocator<char> *)&local_170);
          CodeWriter::operator+=(this_00,text);
        }
        std::__cxx11::string::~string((string *)text);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"if constexpr (Index == {{FIELD_INDEX}}) \\",
                   (allocator<char> *)&local_170);
        CodeWriter::operator+=(this_00,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"return {{FIELD_NAME}}();",(allocator<char> *)&local_170);
        CodeWriter::operator+=(this_00,&local_b0);
        local_180 = local_180 + 1;
        std::__cxx11::string::~string((string *)&local_b0);
        bVar1 = true;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,
               "    else static_assert(Index != Index, \"Invalid Field Index\");",
               (allocator<char> *)&local_170);
    CodeWriter::operator+=(this_00,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"  }",(allocator<char> *)&local_170);
    CodeWriter::operator+=(this_00,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
  }
  return;
}

Assistant:

void GenIndexBasedFieldGetter(const StructDef &struct_def) {
    if (struct_def.fields.vec.empty()) { return; }
    code_ += "  template<size_t Index>";
    code_ += "  auto get_field() const {";

    size_t index = 0;
    bool need_else = false;
    // Generate one index-based getter for each field.
    for (const auto &field : struct_def.fields.vec) {
      if (field->deprecated) {
        // Deprecated fields won't be accessible.
        continue;
      }
      code_.SetValue("FIELD_NAME", Name(*field));
      code_.SetValue("FIELD_INDEX",
                     std::to_string(static_cast<long long>(index++)));
      if (need_else) {
        code_ += "    else \\";
      } else {
        code_ += "         \\";
      }
      need_else = true;
      code_ += "if constexpr (Index == {{FIELD_INDEX}}) \\";
      code_ += "return {{FIELD_NAME}}();";
    }
    code_ += "    else static_assert(Index != Index, \"Invalid Field Index\");";
    code_ += "  }";
  }